

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-builder.h
# Opt level: O0

NumericExpr __thiscall
mp::ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_>::MakeIf
          (ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_> *this,LogicalExpr condition,
          NumericExpr then_expr,NumericExpr else_expr)

{
  Argument1 in_RDI;
  TestProblemBuilder *this_00;
  undefined1 local_51 [17];
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  BasicTestExpr<0> *local_28;
  BasicTestExpr<0> *local_20 [2];
  undefined1 local_10 [8];
  BasicTestExpr<0> local_8;
  BasicTestExpr<0> local_4;
  
  local_20[0] = &local_8;
  local_28 = (BasicTestExpr<0> *)(local_10 + 4);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10;
  internal::Unused<BasicTestExpr<0>*,BasicTestExpr<0>*,BasicTestExpr<0>*>
            (local_20,&local_28,(BasicTestExpr<0> **)&stack0xffffffffffffffd0);
  this_00 = (TestProblemBuilder *)local_51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  TestProblemBuilder::ReportUnhandledConstruct(this_00,in_RDI);
  std::__cxx11::string::~string((string *)(local_51 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_51);
  BasicTestExpr<0>::BasicTestExpr(&local_4,NULL_ID);
  return (NumericExpr)local_4.id_;
}

Assistant:

NumericExpr MakeIf(LogicalExpr condition,
      NumericExpr then_expr, NumericExpr else_expr) {
    internal::Unused(&condition, &then_expr, &else_expr);
    MP_DISPATCH(ReportUnhandledConstruct("if expression"));
    return NumericExpr();
  }